

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O0

void h261_print_gob(h261_gob *gob)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  uint *in_RDI;
  int k;
  int j;
  h261_macroblock *mb;
  int y;
  int x;
  int gy;
  int gx;
  int i;
  int local_30;
  uint local_2c;
  uint local_c;
  
  printf("Group of blocks:\n");
  printf("\tGN = %d\n",(ulong)*in_RDI);
  printf("\tGQUANT = %d\n",(ulong)in_RDI[1]);
  iVar2 = 0xb;
  if ((*in_RDI & 1) != 0) {
    iVar2 = 0;
  }
  uVar1 = *in_RDI;
  for (local_c = 0; (int)local_c < 0x21; local_c = local_c + 1) {
    printf("\tMacroblock %d (%d, %d):\n",(ulong)local_c,(ulong)(uint)(iVar2 + (int)local_c % 0xb),
           (ulong)((uVar1 - 1 >> 1) * 3 + (int)local_c / 0xb));
    printf("\t\tMTYPE =");
    puVar3 = in_RDI + (long)(int)local_c * 0x185 + 2;
    if (*puVar3 == 0) {
      printf(" [SKIPPED]");
    }
    if ((*puVar3 & 1) != 0) {
      printf(" CODED");
    }
    if ((*puVar3 & 2) != 0) {
      printf(" INTRA");
    }
    if ((*puVar3 & 4) != 0) {
      printf(" QUANT");
    }
    if ((*puVar3 & 8) != 0) {
      printf(" MC");
    }
    if ((*puVar3 & 0x10) != 0) {
      printf(" FIL");
    }
    printf("\n");
    if ((*puVar3 & 3) != 0) {
      printf("\t\tMQUANT = %d\n",(ulong)puVar3[1]);
    }
    if ((*puVar3 & 8) != 0) {
      printf("\t\tMVD = %d %d\n",(ulong)puVar3[2],(ulong)puVar3[3]);
    }
    printf("\t\tCBP = 0x%02x\n",(ulong)puVar3[4]);
    for (local_2c = 0; (int)local_2c < 6; local_2c = local_2c + 1) {
      if ((puVar3[4] & 1 << ((byte)local_2c & 0x1f)) != 0) {
        printf("\t\tBlock %d:",(ulong)local_2c);
        for (local_30 = 0; local_30 < 0x40; local_30 = local_30 + 1) {
          printf(" %d",(ulong)puVar3[(long)(int)local_2c * 0x40 + (long)local_30 + 5]);
        }
        printf("\n");
      }
    }
  }
  return;
}

Assistant:

void h261_print_gob(struct h261_gob *gob) {
	int i;
	printf("Group of blocks:\n");
	printf("\tGN = %d\n", gob->gn);
	printf("\tGQUANT = %d\n", gob->gquant);
	int gx = (gob->gn & 1 ? 0 : H261_GOB_WIDTH);
	int gy = ((gob->gn - 1) >> 1) * H261_GOB_HEIGHT;
	for (i = 0; i < H261_GOB_MBS; i++) {
		int x = gx + i % H261_GOB_WIDTH;
		int y = gy + i / H261_GOB_WIDTH;
		printf("\tMacroblock %d (%d, %d):\n", i, x, y);
		printf("\t\tMTYPE =");
		struct h261_macroblock *mb = &gob->mbs[i];
		if (!mb->mtype) printf(" [SKIPPED]");
		if (mb->mtype & H261_MTYPE_FLAG_CODED) printf(" CODED");
		if (mb->mtype & H261_MTYPE_FLAG_INTRA) printf(" INTRA");
		if (mb->mtype & H261_MTYPE_FLAG_QUANT) printf(" QUANT");
		if (mb->mtype & H261_MTYPE_FLAG_MC) printf(" MC");
		if (mb->mtype & H261_MTYPE_FLAG_FIL) printf(" FIL");
		printf("\n");
		if (mb->mtype & (H261_MTYPE_FLAG_CODED | H261_MTYPE_FLAG_INTRA))
			printf("\t\tMQUANT = %d\n", mb->mquant);
		if (mb->mtype & H261_MTYPE_FLAG_MC) {
			printf("\t\tMVD = %d %d\n", mb->mvd[0], mb->mvd[1]);
		}
		printf("\t\tCBP = 0x%02x\n", mb->cbp);
		int j;
		for (j = 0; j < 6; j++) {
			if (mb->cbp & (1 << j)) {
				printf("\t\tBlock %d:", j);
				int k;
				for (k = 0; k < 64; k++)
					printf(" %d", mb->block[j][k]);
				printf("\n");
			}
		}
	}
}